

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cpp
# Opt level: O0

void __thiscall Strings::QuotedEncoding::quoteChar(QuotedEncoding *this,char c)

{
  char c_local;
  QuotedEncoding *this_local;
  
  if (this->lastOne != -1) {
    if ((this->lastOne == 0xd) && (c == '\n')) {
      writeASCII(this,(char)this->lastOne);
    }
    if ((c == '\r') || (c == '\n')) {
      writeHex(this,(char)this->lastOne);
    }
    else {
      writeASCII(this,(char)this->lastOne);
    }
    this->lastOne = -1;
  }
  if ((c == '\t') || (c == ' ')) {
    this->lastOne = (int)c;
  }
  else if (((c == '\r') || (c == '\n')) || ((' ' < c && ((c < '\x7f' && (c != '=')))))) {
    writeASCII(this,c);
  }
  else {
    writeHex(this,c);
  }
  return;
}

Assistant:

inline void quoteChar(const char c)
        {
            if (lastOne != -1)
            {
                // CRLF is allowed on end of line
                if (lastOne == '\r' && c == '\n')
			        writeASCII((char)lastOne);
	            if (c == '\r' || c == '\n')
		            writeHex((char)lastOne);
	            else writeASCII((char)lastOne);

	            lastOne = -1;
            }
            if (c == '\t' || c == ' ') lastOne = (int)c;
            else if (c == '\r' || c == '\n' || (c > 32 && c < 127 && c != '=')) writeASCII(c);
            else writeHex(c);
        }